

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O3

void address_space_stb_cached_slow_sparc64
               (uc_struct_conflict9 *uc,MemoryRegionCache *cache,hwaddr addr,uint32_t val,
               MemTxAttrs attrs,MemTxResult *result)

{
  MemTxResult MVar1;
  undefined1 *puVar2;
  AddressSpace **target_as_00;
  IOMMUMemoryRegion *iommu_mr;
  hwaddr addr1;
  hwaddr l;
  AddressSpace *target_as;
  undefined1 local_70 [8];
  MemoryRegionSection local_68;
  
  if (cache->ptr == (void *)0x0) {
    target_as_00 = (AddressSpace **)(addr + cache->xlat);
    iommu_mr = (IOMMUMemoryRegion *)(cache->mrs).mr;
    if ((iommu_mr != (IOMMUMemoryRegion *)0x0) && ((iommu_mr->parent_obj).is_iommu != false)) {
      address_space_translate_iommu
                (&local_68,iommu_mr,(hwaddr *)&stack0xffffffffffffff80,
                 (hwaddr *)&stack0xffffffffffffff88,(hwaddr *)&DAT_00000001,SUB81(local_70,0),
                 attrs._0_1_,target_as_00,(MemTxAttrs)0x1);
      iommu_mr = (IOMMUMemoryRegion *)local_68.mr;
    }
    if (((iommu_mr->parent_obj).ram == false) || ((iommu_mr->parent_obj).readonly == true)) {
      MVar1 = memory_region_dispatch_write_sparc64
                        (uc,&iommu_mr->parent_obj,(hwaddr)target_as_00,(ulong)val,MO_8,attrs);
    }
    else {
      puVar2 = (undefined1 *)
               qemu_map_ram_ptr_sparc64
                         ((uc_struct_conflict9 *)(iommu_mr->parent_obj).uc,
                          (iommu_mr->parent_obj).ram_block,(ram_addr_t)target_as_00);
      *puVar2 = (char)val;
      MVar1 = 0;
    }
    if (result != (MemTxResult *)0x0) {
      *result = MVar1;
    }
    return;
  }
  __assert_fail("!cache->ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x7b1,
                "MemoryRegion *address_space_translate_cached(MemoryRegionCache *, hwaddr, hwaddr *, hwaddr *, _Bool, MemTxAttrs)"
               );
}

Assistant:

void glue(address_space_stb, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 1;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (!memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val, MO_8, attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        stb_p(ptr, val);
        invalidate_and_set_dirty(mr, addr1, 1);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}